

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  Slice user_key;
  string tmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tmp._M_dataplus._M_p = (key->_M_dataplus)._M_p;
  tmp._M_string_length = key->_M_string_length;
  user_key = ExtractUserKey((Slice *)&tmp);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tmp,user_key.data_,user_key.data_ + user_key.size_);
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,&tmp);
  if (tmp._M_string_length < user_key.size_) {
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&user_key);
    if (iVar2 < 0) {
      PutFixed64(&tmp,0xffffffffffffff01);
      iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
      if (-1 < iVar2) {
        __assert_fail("this->Compare(*key, tmp) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                      ,0x5f,
                      "virtual void leveldb::InternalKeyComparator::FindShortSuccessor(std::string *) const"
                     );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (key,&tmp);
    }
  }
  std::__cxx11::string::~string((string *)&tmp);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}